

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_4.h
# Opt level: O0

int __thiscall
PlayerMike_4::select
          (PlayerMike_4 *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  int iVar1;
  int iVar2;
  int r;
  int sum;
  undefined4 local_4;
  
  iVar1 = __nfds + (int)__readfds + (int)__writefds;
  if (iVar1 == 0) {
    local_4 = rand();
    local_4 = local_4 % 3;
  }
  else {
    iVar2 = rand();
    iVar2 = iVar2 % iVar1;
    if (iVar2 < __nfds) {
      local_4 = 0;
    }
    else if (iVar2 < __nfds + (int)__readfds) {
      local_4 = 1;
    }
    else {
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

int select(int val0, int val1, int val2)
   {
#ifdef DEBUG
      std::cout << "vals=" << val0 << ", " << val1 << ", " << val2 << std::endl;
#endif
      int sum = val0+val1+val2;
      if (sum == 0)
         return rand() % 3;

      int r = rand()%sum;
      if (r < val0)
         return 0;
      if (r < val0+val1)
         return 1;
      return 2;
   }